

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

UBool __thiscall icu_63::Formattable::operator==(Formattable *this,Formattable *that)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  UnicodeString *this_00;
  UnicodeString *text;
  UBool UVar4;
  int32_t iVar5;
  int32_t len;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  bVar8 = true;
  if (this == that) {
    return '\x01';
  }
  if (this->fType != that->fType) goto LAB_00296e94;
  switch(this->fType) {
  case kDate:
  case kDouble:
    bVar8 = (bool)(-((that->fValue).fDouble == (this->fValue).fDouble) & 1);
    break;
  case kLong:
  case kInt64:
    bVar8 = (this->fValue).fObject == (that->fValue).fObject;
    break;
  case kString:
    this_00 = (this->fValue).fString;
    text = (that->fValue).fString;
    uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this_00->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      bVar8 = false;
      if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
        UVar4 = icu_63::UnicodeString::doEquals(this_00,text,len);
        bVar8 = UVar4 != '\0';
      }
    }
    else {
      bVar8 = (bool)(*(byte *)&text->fUnion & 1);
    }
    break;
  case kArray:
    iVar3 = (this->fValue).fArrayAndCount.fCount;
    if (iVar3 == (that->fValue).fArrayAndCount.fCount) {
      if (iVar3 < 1) {
        return '\x01';
      }
      lVar6 = 0;
      lVar7 = 0;
      while (UVar4 = operator==((Formattable *)
                                ((long)&((this->fValue).fObject)->_vptr_UObject + lVar6),
                                (Formattable *)
                                ((long)&((that->fValue).fObject)->_vptr_UObject + lVar6)),
            UVar4 != '\0') {
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x70;
        if ((this->fValue).fArrayAndCount.fCount <= lVar7) {
          return '\x01';
        }
      }
    }
    goto LAB_00296e94;
  case kObject:
    if (((Measure *)(this->fValue).fObject != (Measure *)0x0) &&
       ((that->fValue).fObject != (UObject *)0x0)) {
      UVar4 = Measure::operator==((Measure *)(this->fValue).fObject,(that->fValue).fObject);
      return UVar4;
    }
LAB_00296e94:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

UBool
Formattable::operator==(const Formattable& that) const
{
    int32_t i;

    if (this == &that) return TRUE;

    // Returns FALSE if the data types are different.
    if (fType != that.fType) return FALSE;

    // Compares the actual data values.
    UBool equal = TRUE;
    switch (fType) {
    case kDate:
        equal = (fValue.fDate == that.fValue.fDate);
        break;
    case kDouble:
        equal = (fValue.fDouble == that.fValue.fDouble);
        break;
    case kLong:
    case kInt64:
        equal = (fValue.fInt64 == that.fValue.fInt64);
        break;
    case kString:
        equal = (*(fValue.fString) == *(that.fValue.fString));
        break;
    case kArray:
        if (fValue.fArrayAndCount.fCount != that.fValue.fArrayAndCount.fCount) {
            equal = FALSE;
            break;
        }
        // Checks each element for equality.
        for (i=0; i<fValue.fArrayAndCount.fCount; ++i) {
            if (fValue.fArrayAndCount.fArray[i] != that.fValue.fArrayAndCount.fArray[i]) {
                equal = FALSE;
                break;
            }
        }
        break;
    case kObject:
        if (fValue.fObject == NULL || that.fValue.fObject == NULL) {
            equal = FALSE;
        } else {
            equal = objectEquals(fValue.fObject, that.fValue.fObject);
        }
        break;
    }

    // TODO:  compare digit lists if numeric.
    return equal;
}